

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmEndMacroCommand::InvokeInitialPass
          (cmEndMacroCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
             ,"");
  cmCommand::SetError(&this->super_cmCommand,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmEndMacroCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDMACRO command was found outside of a proper "
                 "MACRO ENDMACRO structure. Or its arguments did not "
                 "match the opening MACRO command.");
  return false;
}